

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkGeometryFlagsKHR Diligent::GeometryFlagsToVkGeometryFlags(RAYTRACING_GEOMETRY_FLAGS Flags)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  uint local_10;
  RAYTRACING_GEOMETRY_FLAGS FlagBit;
  VkGeometryFlagsKHR Result;
  RAYTRACING_GEOMETRY_FLAGS Flags_local;
  
  local_10 = 0;
  FlagBit = Flags;
  while (FlagBit != RAYTRACING_GEOMETRY_FLAG_NONE) {
    msg.field_2._M_local_buf[0xf] = ExtractLSB<Diligent::RAYTRACING_GEOMETRY_FLAGS>(&FlagBit);
    if (msg.field_2._M_local_buf[0xf] == RAYTRACING_GEOMETRY_FLAG_OPAQUE) {
      local_10 = local_10 | 1;
    }
    else if (msg.field_2._M_local_buf[0xf] == RAYTRACING_GEOMETRY_FLAG_LAST) {
      local_10 = local_10 | 2;
    }
    else {
      FormatString<char[22]>((string *)local_38,(char (*) [22])"unknown geometry flag");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"GeometryFlagsToVkGeometryFlags",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x6f0);
      std::__cxx11::string::~string((string *)local_38);
    }
  }
  return local_10;
}

Assistant:

VkGeometryFlagsKHR GeometryFlagsToVkGeometryFlags(RAYTRACING_GEOMETRY_FLAGS Flags)
{
    static_assert(RAYTRACING_GEOMETRY_FLAG_LAST == RAYTRACING_GEOMETRY_FLAG_NO_DUPLICATE_ANY_HIT_INVOCATION,
                  "Please update the switch below to handle the new ray tracing geometry flag");

    VkGeometryFlagsKHR Result = 0;
    while (Flags != RAYTRACING_GEOMETRY_FLAG_NONE)
    {
        RAYTRACING_GEOMETRY_FLAGS FlagBit = ExtractLSB(Flags);
        switch (FlagBit)
        {
            // clang-format off
            case RAYTRACING_GEOMETRY_FLAG_OPAQUE:                          Result |= VK_GEOMETRY_OPAQUE_BIT_KHR;                          break;
            case RAYTRACING_GEOMETRY_FLAG_NO_DUPLICATE_ANY_HIT_INVOCATION: Result |= VK_GEOMETRY_NO_DUPLICATE_ANY_HIT_INVOCATION_BIT_KHR; break;
            // clang-format on
            default: UNEXPECTED("unknown geometry flag");
        }
    }
    return Result;
}